

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

bool CLIntercept::Create(void *pGlobalData,CLIntercept **pIntercept)

{
  uint uVar1;
  CLIntercept **pIntercept_00;
  long *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  bool success;
  void *in_stack_00000848;
  CLIntercept *in_stack_00000850;
  undefined1 local_11;
  
  local_11 = false;
  pIntercept_00 = (CLIntercept **)operator_new(0x9f58);
  CLIntercept(in_stack_00000850,in_stack_00000848);
  *in_RSI = (long)pIntercept_00;
  if (*in_RSI != 0) {
    uVar1 = init((CLIntercept *)*in_RSI,in_RDI);
    local_11 = (bool)((byte)uVar1 & 1);
    if ((uVar1 & 1) == 0) {
      Delete(pIntercept_00);
    }
  }
  return local_11;
}

Assistant:

bool CLIntercept::Create( void* pGlobalData, CLIntercept*& pIntercept )
{
    bool    success = false;

    pIntercept = new CLIntercept( pGlobalData );
    if( pIntercept )
    {
        success = pIntercept->init();
        if( success == false )
        {
            Delete( pIntercept );
        }
    }

    return success;
}